

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sig.c
# Opt level: O1

err_t cmdSigVerify2(char *name,char *sig_name,octet *anchor,size_t anchor_len)

{
  octet *date;
  bign_params *params;
  cmd_sig_t *pcVar1;
  bool_t bVar2;
  err_t eVar3;
  cmd_sig_t *sig;
  undefined1 *puVar4;
  char *oid;
  octet *poVar5;
  size_t oid_len;
  size_t drop;
  size_t cert_len;
  size_t offset;
  size_t local_78;
  bign_params *local_70;
  octet *local_68;
  cmd_sig_t *local_60;
  octet *local_58;
  octet *local_50;
  octet *local_48;
  size_t local_40;
  size_t local_38;
  
  local_78 = 0x10;
  bVar2 = strIsValid(name);
  if (bVar2 == 0) {
    return 0x6d;
  }
  bVar2 = strIsValid(sig_name);
  if (bVar2 == 0) {
    return 0x6d;
  }
  bVar2 = memIsValid(anchor,anchor_len);
  if (bVar2 == 0) {
    return 0x6d;
  }
  sig = (cmd_sig_t *)blobCreate(local_78 + 0x8e8);
  if (sig == (cmd_sig_t *)0x0) {
    return 0x6e;
  }
  local_68 = sig[1].certs + 0x210;
  poVar5 = local_68 + local_78;
  local_60 = sig;
  eVar3 = cmdSigRead(sig,(size_t *)&local_48,sig_name);
  if (eVar3 == 0) {
    local_50 = poVar5;
    bVar2 = cmdFileAreSame(name,sig_name);
    pcVar1 = local_60;
    if (bVar2 == 0) {
      local_58 = local_48;
      puVar4 = (undefined1 *)cmdFileSize(sig_name);
      eVar3 = 0x132;
      if (local_58 != puVar4) goto LAB_00107057;
      local_48 = (octet *)0x0;
    }
    poVar5 = pcVar1->certs;
    eVar3 = cmdCVCsFind((size_t *)0x0,poVar5,sig->certs_len,anchor,anchor_len);
    if (eVar3 == 0) {
      date = local_60->date;
      eVar3 = cmdCVCsVal(poVar5,sig->certs_len,date);
      pcVar1 = local_60;
      if (((eVar3 == 0) &&
          (eVar3 = cmdCVCsGetLast(&local_38,&local_40,poVar5,sig->certs_len), eVar3 == 0)) &&
         (eVar3 = btokCVCUnwrap((btok_cvc_t *)(pcVar1 + 1),poVar5 + local_38,local_40,(octet *)0x0,0
                               ), eVar3 == 0)) {
        params = (bign_params *)(pcVar1[1].certs + 0xc0);
        local_58 = poVar5;
        eVar3 = cmdSigParamsStd(params,*(ulong *)(sig[1].certs + 0x38) >> 1);
        if ((eVar3 == 0) &&
           (local_70 = params,
           eVar3 = cmdSigHash(local_50,*(ulong *)(sig[1].certs + 0x38) >> 1,name,(size_t)local_48,
                              local_58,sig->certs_len,date), eVar3 == 0)) {
          if (*(ulong *)(sig[1].certs + 0x38) < 0x41) {
            oid = "1.2.112.0.2.0.34.101.31.81";
          }
          else {
            oid = "1.2.112.0.2.0.34.101.77.13";
            if (*(ulong *)(sig[1].certs + 0x38) == 0x60) {
              oid = "1.2.112.0.2.0.34.101.77.12";
            }
          }
          eVar3 = bignOidToDER(local_68,&local_78,oid);
          if (eVar3 == 0) {
            poVar5 = local_60[1].sig + 0x1a;
            if (*(long *)(sig[1].certs + 0x38) == 0x30) {
              eVar3 = bign96PubkeyVal(local_70,poVar5);
            }
            else {
              eVar3 = bignPubkeyVal(local_70,poVar5);
            }
            if (eVar3 == 0) {
              if (*(long *)(sig[1].certs + 0x38) == 0x30) {
                eVar3 = bign96Verify(local_70,local_68,local_78,local_50,(octet *)sig,poVar5);
              }
              else {
                eVar3 = bignVerify(local_70,local_68,local_78,local_50,(octet *)sig,poVar5);
              }
            }
          }
        }
      }
    }
  }
LAB_00107057:
  blobClose(sig);
  return eVar3;
}

Assistant:

err_t cmdSigVerify2(const char* name, const char* sig_name,
	const octet anchor[], size_t anchor_len)
{
	err_t code;
	void* stack;
	cmd_sig_t* sig;
	btok_cvc_t* cvc;
	bign_params* params;
	octet* oid_der;
	size_t oid_len = 16;
	octet* hash;
	size_t drop;
	size_t offset;
	size_t cert_len;
	// входной контроль
	if (!strIsValid(name) || !strIsValid(sig_name) ||
		!memIsValid(anchor, anchor_len))
		return ERR_BAD_INPUT;
	// выделить и разметить память
	code = cmdBlobCreate(stack, sizeof(cmd_sig_t) + sizeof(btok_cvc_t) +
		sizeof(bign_params) + oid_len + 64);
	ERR_CALL_CHECK(code);
	sig = (cmd_sig_t*)stack;
	cvc = (btok_cvc_t*)(sig + 1);
	params = (bign_params*)(cvc + 1);
	oid_der = (octet*)(params + 1);
	hash = oid_der + oid_len;
	// читать подпись
	code = cmdSigRead(sig, &drop, sig_name);	
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// подпись в отдельном файле?
	if (!cmdFileAreSame(name, sig_name))
	{
		code = drop == cmdFileSize(sig_name) ? ERR_OK : ERR_BAD_FORMAT;
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		drop = 0;
	}
	// цепочка сертификатов включает anchor?
	code = cmdCVCsFind(0, sig->certs, sig->certs_len, anchor, anchor_len);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// проверить цепочку
	code = cmdCVCsVal(sig->certs, sig->certs_len, sig->date);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// найти последний сертификат
	code = cmdCVCsGetLast(&offset, &cert_len, sig->certs, sig->certs_len);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// разобрать последний сертификат
	code = btokCVCUnwrap(cvc, sig->certs + offset, cert_len, 0, 0);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// загрузить долговременные параметры
	code = cmdSigParamsStd(params, cvc->pubkey_len / 2);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// хэшировать
	code = cmdSigHash(hash, cvc->pubkey_len / 2, name, drop, sig->certs, 
		sig->certs_len, sig->date);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	if (cvc->pubkey_len <= 64)
	{
		code = bignOidToDER(oid_der, &oid_len, "1.2.112.0.2.0.34.101.31.81");
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		ASSERT(oid_len == 11);
	}
	else 
	{
		code = bignOidToDER(oid_der, &oid_len, cvc->pubkey_len == 96 ? 
			"1.2.112.0.2.0.34.101.77.12" : "1.2.112.0.2.0.34.101.77.13");
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		ASSERT(oid_len == 11);
	}
	// проверить открытый ключ
	if (cvc->pubkey_len == 48)
		code = bign96PubkeyVal(params, cvc->pubkey);
	else
		code = bignPubkeyVal(params, cvc->pubkey);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// проверить подпись
	if (cvc->pubkey_len == 48)
		code = bign96Verify(params, oid_der, oid_len, hash, sig->sig, 
			cvc->pubkey);
	else
		code = bignVerify(params, oid_der, oid_len, hash, sig->sig, 
			cvc->pubkey);
	// завершить
	cmdBlobClose(stack);
	return code;
}